

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManDfsCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vObjs)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Tim_Man_t *p_00;
  int *piVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  
  while( true ) {
    pGVar2 = p->pObjs;
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_0021a306;
    uVar11 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= (int)uVar11) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (p->pTravIds[(int)uVar11] == p->nTravIds) {
      return;
    }
    p->pTravIds[(int)uVar11] = p->nTravIds;
    uVar6 = *(ulong *)pObj;
    uVar5 = (uint)uVar6;
    if ((~uVar5 & 0x9fffffff) == 0) {
      p_00 = (Tim_Man_t *)p->pManTime;
      if (p_00 == (Tim_Man_t *)0x0) {
        return;
      }
      uVar11 = Tim_ManBoxForCi(p_00,(uint)(uVar6 >> 0x20) & 0x1fffffff);
      if ((int)uVar11 < 0) {
        return;
      }
      iVar4 = Tim_ManBoxOutputFirst(p_00,uVar11);
      uVar5 = Tim_ManBoxOutputNum(p_00,uVar11);
      if ((int)uVar5 < 1) goto LAB_0021a114;
      pVVar7 = p->vCis;
      lVar10 = (long)iVar4;
      uVar6 = (ulong)uVar5;
      goto LAB_0021a0bc;
    }
    uVar8 = uVar5 & 0x1fffffff;
    if ((-1 < (int)uVar5) || (uVar8 == 0x1fffffff)) break;
    pObj = pObj + -(ulong)uVar8;
  }
  if ((int)uVar5 < 0 || uVar8 == 0x1fffffff) {
    if ((~uVar6 & 0x1fffffff1fffffff) == 0) {
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                  ,0x3b0,"void Gia_ManDfsCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  if (pObj < pGVar2 + p->nObjs) {
    pVVar7 = p->vMapping;
    if (pVVar7 == (Vec_Int_t *)0x0) {
      Gia_ManDfsCollect_rec(p,pObj + -(ulong)uVar8,vObjs);
      Gia_ManDfsCollect_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vObjs);
      goto LAB_0021a2f3;
    }
    if (((int)uVar11 < 0) || (pVVar7->nSize <= (int)uVar11)) goto LAB_0021a273;
    if (pVVar7->pArray[uVar11 & 0x7fffffff] == 0) {
      __assert_fail("Gia_ObjIsLut(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                    ,0x3a3,"void Gia_ManDfsCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    pVVar7 = p->vMapping;
    iVar4 = pVVar7->nSize;
    if (iVar4 <= (int)uVar11) goto LAB_0021a273;
    lVar10 = 0;
    goto LAB_0021a210;
  }
LAB_0021a306:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  while( true ) {
    iVar1 = pVVar7->pArray[lVar10];
    if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0021a325;
    if (p->nTravIdsAlloc <= iVar1) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    p->pTravIds[iVar1] = p->nTravIds;
    lVar10 = lVar10 + 1;
    uVar6 = uVar6 - 1;
    if (uVar6 == 0) break;
LAB_0021a0bc:
    if ((iVar4 < 0) || (pVVar7->nSize <= lVar10)) goto LAB_0021a273;
  }
LAB_0021a114:
  iVar4 = Tim_ManBoxInputFirst(p_00,uVar11);
  uVar5 = Tim_ManBoxInputNum(p_00,uVar11);
  if (0 < (int)uVar5) {
    lVar10 = (long)iVar4;
    uVar6 = (ulong)uVar5;
    do {
      if ((iVar4 < 0) || (p->vCos->nSize <= lVar10)) goto LAB_0021a273;
      iVar1 = p->vCos->pArray[lVar10];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0021a325;
      Gia_ManDfsCollect_rec(p,p->pObjs + iVar1,vObjs);
      lVar10 = lVar10 + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  uVar11 = ~uVar11;
LAB_0021a2f3:
  Vec_IntPush(vObjs,uVar11);
  return;
LAB_0021a210:
  do {
    piVar3 = pVVar7->pArray;
    lVar9 = (long)piVar3[uVar11 & 0x7fffffff];
    if ((lVar9 < 0) || (iVar4 <= piVar3[uVar11 & 0x7fffffff])) break;
    if (piVar3[lVar9] <= lVar10) goto LAB_0021a2f3;
    iVar4 = piVar3[lVar9 + lVar10 + 1];
    if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_0021a325:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    Gia_ManDfsCollect_rec(p,p->pObjs + iVar4,vObjs);
    lVar10 = lVar10 + 1;
    pVVar7 = p->vMapping;
    iVar4 = pVVar7->nSize;
  } while ((int)uVar11 < iVar4);
LAB_0021a273:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManDfsCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vObjs )
{
    if ( Gia_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Gia_ObjSetTravIdCurrent( p, pObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
        if ( pManTime )
        {
            int i, iFirst, nTerms, iBox;
            iBox = Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) );
            if ( iBox >= 0 ) // pObj is a box input
            {
                // mark box outputs
                iFirst = Tim_ManBoxOutputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pObj = Gia_ManCi( p, iFirst + i );
                    Gia_ObjSetTravIdCurrent( p, pObj );
                }
                // traverse box inputs
                iFirst = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pObj = Gia_ManCo( p, iFirst + i );
                    Gia_ManDfsCollect_rec( p, pObj, vObjs );
                }
                // save the box
                Vec_IntPush( vObjs, -iBox-1 );
            }
        }
        return;
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_ManDfsCollect_rec( p, Gia_ObjFanin0(pObj), vObjs );
    }
    else if ( Gia_ObjIsAnd(pObj) )
    { 
        int iFan, k, iObj = Gia_ObjId(p, pObj);
        if ( Gia_ManHasMapping(p) )
        {
            assert( Gia_ObjIsLut(p, iObj) );
            Gia_LutForEachFanin( p, iObj, iFan, k )
                Gia_ManDfsCollect_rec( p, Gia_ManObj(p, iFan), vObjs );
        }
        else
        {
            Gia_ManDfsCollect_rec( p, Gia_ObjFanin0(pObj), vObjs );
            Gia_ManDfsCollect_rec( p, Gia_ObjFanin1(pObj), vObjs );
        }
        // save the object
        Vec_IntPush( vObjs, iObj );
    }
    else if ( !Gia_ObjIsConst0(pObj) )
        assert( 0 );
}